

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

void __thiscall
pybind11::array::array
          (array *this,dtype *dt,ShapeContainer *shape,StridesContainer *strides,void *ptr,
          handle base)

{
  _func_PyObject_ptr_PyTypeObject_ptr_PyObject_ptr_int_Py_intptr_t_ptr_Py_intptr_t_ptr_void_ptr_int_PyObject_ptr
  *p_Var1;
  PyTypeObject *pPVar2;
  _func_int_PyObject_ptr_PyObject_ptr *p_Var3;
  _func_PyObject_ptr_PyObject_ptr_int *p_Var4;
  int iVar5;
  bool bVar6;
  vector<long,_std::allocator<long>_> *pvVar7;
  size_type sVar8;
  size_type sVar9;
  PyObject **ppPVar10;
  long *plVar11;
  long *plVar12;
  PyObject *pPVar13;
  undefined8 uVar14;
  PyObject *pPVar15;
  any_container<long> *in_RCX;
  any_container<long> *in_RDX;
  undefined8 *in_RDI;
  void *in_R8;
  PyObject *in_R9;
  object tmp;
  npy_api *api;
  int flags;
  dtype descr;
  size_type ndim;
  undefined4 in_stack_fffffffffffffe48;
  uint uVar16;
  undefined4 in_stack_fffffffffffffe4c;
  handle in_stack_fffffffffffffe50;
  handle *phVar17;
  handle in_stack_fffffffffffffe58;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe60;
  error_already_set *in_stack_fffffffffffffe70;
  ssize_t in_stack_fffffffffffffea0;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffea8;
  handle local_c0;
  handle local_b8 [2];
  handle local_a8;
  handle local_a0;
  handle local_98;
  npy_api *local_90;
  PyObject *local_88;
  PyObject *local_78;
  uint local_6c;
  size_type local_60;
  void *local_30;
  handle local_8;
  
  local_30 = in_R8;
  local_8.m_ptr = in_R9;
  pybind11::buffer::buffer((buffer *)0x2c63bc);
  pybind11::detail::any_container<long>::operator->(in_RCX);
  bVar6 = std::vector<long,_std::allocator<long>_>::empty(in_stack_fffffffffffffe60);
  if (bVar6) {
    pybind11::detail::any_container<long>::operator*(in_RDX);
    pybind11::dtype::itemsize((dtype *)0x2c640d);
    pybind11::detail::c_strides(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    pybind11::detail::any_container<long>::operator*(in_RCX);
    std::vector<long,_std::allocator<long>_>::operator=
              (in_stack_fffffffffffffe60,
               (vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe58.m_ptr);
    std::vector<long,_std::allocator<long>_>::~vector(in_stack_fffffffffffffe60);
  }
  pvVar7 = pybind11::detail::any_container<long>::operator->(in_RDX);
  sVar8 = std::vector<long,_std::allocator<long>_>::size(pvVar7);
  local_60 = sVar8;
  pvVar7 = pybind11::detail::any_container<long>::operator->(in_RCX);
  sVar9 = std::vector<long,_std::allocator<long>_>::size(pvVar7);
  if (sVar8 == sVar9) {
    pybind11::dtype::dtype
              ((dtype *)in_stack_fffffffffffffe50.m_ptr,
               (dtype *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_6c = 0;
    bVar6 = pybind11::handle::operator_cast_to_bool(&local_8);
    if ((bVar6) && (local_30 != (void *)0x0)) {
      local_78 = local_8.m_ptr;
      bVar6 = isinstance<pybind11::array,_0>(in_stack_fffffffffffffe50);
      if (bVar6) {
        local_88 = local_8.m_ptr;
        reinterpret_borrow<pybind11::array>(in_stack_fffffffffffffe58);
        local_6c = array::flags((array *)0x2c65df);
        local_6c = local_6c & 0xfffffffb;
        ~array((array *)0x2c6606);
      }
      else {
        local_6c = 0x400;
      }
    }
    local_90 = pybind11::detail::npy_api::get();
    p_Var1 = local_90->PyArray_NewFromDescr_;
    pPVar2 = local_90->PyArray_Type_;
    local_a8 = object::release((object *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    ppPVar10 = pybind11::handle::ptr(&local_a8);
    pPVar13 = *ppPVar10;
    iVar5 = (int)local_60;
    pybind11::detail::any_container<long>::operator->(in_RDX);
    plVar11 = std::vector<long,_std::allocator<long>_>::data
                        ((vector<long,_std::allocator<long>_> *)0x2c66f8);
    pybind11::detail::any_container<long>::operator->(in_RCX);
    plVar12 = std::vector<long,_std::allocator<long>_>::data
                        ((vector<long,_std::allocator<long>_> *)0x2c671b);
    phVar17 = (handle *)0x0;
    uVar16 = local_6c;
    pPVar13 = (*p_Var1)(pPVar2,pPVar13,iVar5,plVar11,plVar12,local_30,local_6c,(PyObject *)0x0);
    pybind11::handle::handle<_object_*,_0>(&local_a0,pPVar13);
    reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe58);
    bVar6 = pybind11::handle::operator_cast_to_bool(&local_98);
    if (bVar6) {
      if (local_30 != (void *)0x0) {
        bVar6 = pybind11::handle::operator_cast_to_bool(&local_8);
        if (bVar6) {
          p_Var3 = local_90->PyArray_SetBaseObject_;
          ppPVar10 = pybind11::handle::ptr(&local_98);
          pPVar13 = *ppPVar10;
          phVar17 = pybind11::handle::inc_ref(phVar17);
          pPVar15 = pybind11::handle::ptr(phVar17);
          (*p_Var3)(pPVar13,pPVar15);
        }
        else {
          p_Var4 = local_90->PyArray_NewCopy_;
          ppPVar10 = pybind11::handle::ptr(&local_98);
          pPVar13 = (*p_Var4)(*ppPVar10,-1);
          pybind11::handle::handle<_object_*,_0>(local_b8,pPVar13);
          reinterpret_steal<pybind11::object>(in_stack_fffffffffffffe58);
          object::operator=((object *)in_stack_fffffffffffffe60,
                            (object *)in_stack_fffffffffffffe58.m_ptr);
          object::~object((object *)0x2c6914);
        }
      }
      local_c0 = object::release((object *)CONCAT44(in_stack_fffffffffffffe4c,uVar16));
      ppPVar10 = pybind11::handle::ptr(&local_c0);
      *in_RDI = *ppPVar10;
      object::~object((object *)0x2c6962);
      pybind11::dtype::~dtype((dtype *)0x2c696f);
      return;
    }
    uVar14 = __cxa_allocate_exception(0x18);
    error_already_set::error_already_set(in_stack_fffffffffffffe70);
    __cxa_throw(uVar14,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail((char *)in_stack_fffffffffffffe60);
}

Assistant:

array(const pybind11::dtype &dt,
          ShapeContainer shape,
          StridesContainer strides,
          const void *ptr = nullptr,
          handle base = handle()) {

        if (strides->empty()) {
            *strides = detail::c_strides(*shape, dt.itemsize());
        }

        auto ndim = shape->size();
        if (ndim != strides->size()) {
            pybind11_fail("NumPy: shape ndim doesn't match strides ndim");
        }
        auto descr = dt;

        int flags = 0;
        if (base && ptr) {
            if (isinstance<array>(base)) {
                /* Copy flags from base (except ownership bit) */
                flags = reinterpret_borrow<array>(base).flags()
                        & ~detail::npy_api::NPY_ARRAY_OWNDATA_;
            } else {
                /* Writable by default, easy to downgrade later on if needed */
                flags = detail::npy_api::NPY_ARRAY_WRITEABLE_;
            }
        }

        auto &api = detail::npy_api::get();
        auto tmp = reinterpret_steal<object>(api.PyArray_NewFromDescr_(
            api.PyArray_Type_,
            descr.release().ptr(),
            (int) ndim,
            // Use reinterpret_cast for PyPy on Windows (remove if fixed, checked on 7.3.1)
            reinterpret_cast<Py_intptr_t *>(shape->data()),
            reinterpret_cast<Py_intptr_t *>(strides->data()),
            const_cast<void *>(ptr),
            flags,
            nullptr));
        if (!tmp) {
            throw error_already_set();
        }
        if (ptr) {
            if (base) {
                api.PyArray_SetBaseObject_(tmp.ptr(), base.inc_ref().ptr());
            } else {
                tmp = reinterpret_steal<object>(
                    api.PyArray_NewCopy_(tmp.ptr(), -1 /* any order */));
            }
        }
        m_ptr = tmp.release().ptr();
    }